

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O1

void __thiscall
embree::sse2::collision_regression_test::collision_regression_test
          (collision_regression_test *this,char *name)

{
  allocator local_41;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_02202ab8
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,local_40,local_40 + local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_02207f28;
  registerRegressionTest((RegressionTest *)0xc8654e);
  return;
}

Assistant:

collision_regression_test(const char* name) : RegressionTest(name) {
        registerRegressionTest(this);
      }